

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O1

int m_id(aec_stream_conflict *strm)

{
  internal_state_conflict *piVar1;
  byte *pbVar2;
  _func_int_aec_stream_ptr_conflict *UNRECOVERED_JUMPTABLE;
  uint32_t uVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  
  uVar5 = strm->avail_in;
  piVar1 = strm->state;
  iVar4 = piVar1->id_len;
  if (uVar5 < piVar1->in_blklen) {
    iVar6 = piVar1->bitp;
    while (iVar6 < iVar4) {
      uVar5 = uVar5 - 1;
      if (uVar5 == 0xffffffffffffffff) {
        piVar1->mode = m_id;
        return 0;
      }
      strm->avail_in = uVar5;
      uVar7 = piVar1->acc << 8;
      piVar1->acc = uVar7;
      pbVar2 = strm->next_in;
      strm->next_in = pbVar2 + 1;
      piVar1->acc = *pbVar2 | uVar7;
      iVar6 = iVar6 + 8;
      piVar1->bitp = iVar6;
    }
    iVar6 = piVar1->bitp - iVar4;
    piVar1->id = (uint)(piVar1->acc >> ((byte)iVar6 & 0x3f)) &
                 (uint)(0xffffffffffffffff >> (-(char)iVar4 & 0x3fU));
    piVar1->bitp = iVar6;
  }
  else {
    uVar3 = direct_get(strm,iVar4);
    piVar1->id = uVar3;
  }
  UNRECOVERED_JUMPTABLE = piVar1->id_table[piVar1->id];
  piVar1->mode = UNRECOVERED_JUMPTABLE;
  iVar4 = (*UNRECOVERED_JUMPTABLE)(strm);
  return iVar4;
}

Assistant:

static inline int m_id(struct aec_stream *strm)
{
    struct internal_state *state = strm->state;
    if (strm->avail_in >= strm->state->in_blklen) {
        state->id = direct_get(strm, state->id_len);
    } else {
        if (bits_ask(strm, state->id_len) == 0) {
            state->mode = m_id;
            return M_EXIT;
        }
        state->id = bits_get(strm, state->id_len);
        bits_drop(strm, state->id_len);
    }
    state->mode = state->id_table[state->id];
    return(state->mode(strm));
}